

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  undefined8 *puVar2;
  long *plVar3;
  ulong *puVar4;
  ulong uVar5;
  long lVar6;
  long *local_268;
  long local_258;
  undefined8 uStack_250;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  ulong *local_228;
  long local_220;
  ulong local_218;
  long lStack_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < *(int *)((long)this + 0xc)) {
    lVar6 = 0;
    do {
      local_1c8 = &local_1b8;
      local_1c0 = 0;
      local_1b8 = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      local_208 = &local_1f8;
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_1f8 = *plVar3;
        lStack_1f0 = plVar1[3];
      }
      else {
        local_1f8 = *plVar3;
        local_208 = (long *)*plVar1;
      }
      local_200 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_208);
      local_1e8 = &local_1d8;
      plVar3 = plVar1 + 2;
      if ((long *)*plVar1 == plVar3) {
        local_1d8 = *plVar3;
        lStack_1d0 = plVar1[3];
      }
      else {
        local_1d8 = *plVar3;
        local_1e8 = (long *)*plVar1;
      }
      local_1e0 = plVar1[1];
      *plVar1 = (long)plVar3;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_1e8);
      puVar4 = (ulong *)(plVar1 + 2);
      if ((ulong *)*plVar1 == puVar4) {
        local_218 = *puVar4;
        lStack_210 = plVar1[3];
        local_228 = &local_218;
      }
      else {
        local_218 = *puVar4;
        local_228 = (ulong *)*plVar1;
      }
      local_220 = plVar1[1];
      *plVar1 = (long)puVar4;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::_M_insert<double>((double)*(float *)((long)this + lVar6 * 4 + 4));
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar5 = 0xf;
      if (local_228 != &local_218) {
        uVar5 = local_218;
      }
      if (uVar5 < (ulong)(local_240 + local_220)) {
        uVar5 = 0xf;
        if (local_248 != local_238) {
          uVar5 = local_238[0];
        }
        if (uVar5 < (ulong)(local_240 + local_220)) goto LAB_0143ed6d;
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_248,0,(char *)0x0,(ulong)local_228);
      }
      else {
LAB_0143ed6d:
        puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_248);
      }
      plVar1 = puVar2 + 2;
      if ((long *)*puVar2 == plVar1) {
        local_258 = *plVar1;
        uStack_250 = puVar2[3];
        local_268 = &local_258;
      }
      else {
        local_258 = *plVar1;
        local_268 = (long *)*puVar2;
      }
      *puVar2 = plVar1;
      puVar2[1] = 0;
      *(undefined1 *)plVar1 = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_268);
      if (local_268 != &local_258) {
        operator_delete(local_268,local_258 + 1);
      }
      if (local_248 != local_238) {
        operator_delete(local_248,local_238[0] + 1);
      }
      if (local_228 != &local_218) {
        operator_delete(local_228,local_218 + 1);
      }
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8,local_1d8 + 1);
      }
      if (local_208 != &local_1f8) {
        operator_delete(local_208,local_1f8 + 1);
      }
      if (local_1c8 != &local_1b8) {
        operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)((long)this + 0xc));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Surface getPixels (const glu::RenderContext& rCtx, const RandomViewport& vp)
{
	return getPixels(rCtx, vp.x, vp.y, vp.width, vp.height);
}